

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalEffects.cpp
# Opt level: O0

void __thiscall wasm::GenerateGlobalEffects::run(GenerateGlobalEffects *this,Module *module)

{
  pair<wasm::Name,_wasm::Name> item;
  pair<wasm::Name,_wasm::Name> item_00;
  bool bVar1;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  *this_00;
  reference pNVar2;
  size_type sVar3;
  reference ppVar4;
  type *ppFVar5;
  type *ptVar6;
  mapped_type *pmVar7;
  EffectAnalyzer *pEVar8;
  EffectAnalyzer *other;
  pair<std::__detail::_Node_iterator<wasm::Name,_true,_true>,_bool> pVar9;
  undefined1 local_368 [24];
  type *info_3;
  type *func_3;
  _Self local_340;
  iterator __end2_3;
  iterator __begin2_3;
  Map *__range2_3;
  Function *local_310;
  mapped_type *local_308;
  optional<wasm::EffectAnalyzer> *callerEffects;
  Name *caller_1;
  iterator __end3_2;
  iterator __begin3_2;
  mapped_type *__range3_2;
  optional<wasm::EffectAnalyzer> *funcEffects;
  type *info_2;
  type *func_2;
  _Self local_2c0;
  iterator __end2_2;
  iterator __begin2_2;
  Map *__range2_2;
  type *info_1;
  type *func_1;
  _Self local_290;
  iterator __end2_1;
  iterator __begin2_1;
  Map *__range2_1;
  char *pcStack_270;
  size_t local_268;
  char *pcStack_260;
  undefined1 auStack_258 [8];
  Name calledByCalled;
  _Node_iterator_base<wasm::Name,_true> local_240;
  iterator __end3_1;
  iterator __begin3_1;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  *__range3_1;
  Function *local_210;
  mapped_type *local_208;
  mapped_type *calledInfo;
  undefined1 local_1f8;
  type *local_1f0;
  type *called_1;
  type *caller;
  pair<wasm::Name,_wasm::Name> local_1c0;
  reference local_1a0;
  Name *called;
  iterator __end3;
  iterator __begin3;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  *__range3;
  type *info;
  type *func;
  _Self local_168;
  iterator __end2;
  iterator __begin2;
  Map *__range2;
  UniqueDeferredQueue<std::pair<wasm::Name,_wasm::Name>_> work;
  unordered_map<wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
  callers;
  anon_class_16_2_49267667 local_80;
  function<void_(wasm::Function_*,_FuncInfo_&)> local_70;
  undefined1 local_50 [8];
  ParallelFunctionAnalysis<FuncInfo,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap> analysis;
  Module *module_local;
  GenerateGlobalEffects *this_local;
  
  local_80.module = (Module **)&analysis.field_0x30;
  local_80.this = this;
  analysis._48_8_ = module;
  std::function<void(wasm::Function*,wasm::GenerateGlobalEffects::run(wasm::Module*)::FuncInfo&)>::
  function<wasm::GenerateGlobalEffects::run(wasm::Module*)::_lambda(wasm::Function*,wasm::GenerateGlobalEffects::run(wasm::Module*)::FuncInfo&)_1_,void>
            ((function<void(wasm::Function*,wasm::GenerateGlobalEffects::run(wasm::Module*)::FuncInfo&)>
              *)&local_70,&local_80);
  wasm::ModuleUtils::
  ParallelFunctionAnalysis<FuncInfo,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>::
  ParallelFunctionAnalysis
            ((ParallelFunctionAnalysis<FuncInfo,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
              *)local_50,module,(Func *)&local_70);
  std::function<void_(wasm::Function_*,_FuncInfo_&)>::~function(&local_70);
  std::
  unordered_map<wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
  ::unordered_map((unordered_map<wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
                   *)&work.count._M_h._M_single_bucket);
  UniqueDeferredQueue<std::pair<wasm::Name,_wasm::Name>_>::UniqueDeferredQueue
            ((UniqueDeferredQueue<std::pair<wasm::Name,_wasm::Name>_> *)&__range2);
  __end2 = std::
           map<wasm::Function_*,_FuncInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_FuncInfo>_>_>
           ::begin((map<wasm::Function_*,_FuncInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_FuncInfo>_>_>
                    *)&analysis);
  local_168._M_node =
       (_Base_ptr)
       std::
       map<wasm::Function_*,_FuncInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_FuncInfo>_>_>
       ::end((map<wasm::Function_*,_FuncInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_FuncInfo>_>_>
              *)&analysis);
  while (bVar1 = std::operator!=(&__end2,&local_168), bVar1) {
    ppVar4 = std::_Rb_tree_iterator<std::pair<wasm::Function_*const,_FuncInfo>_>::operator*(&__end2)
    ;
    ppFVar5 = std::
              get<0ul,wasm::Function*const,wasm::GenerateGlobalEffects::run(wasm::Module*)::FuncInfo>
                        (ppVar4);
    ptVar6 = std::
             get<1ul,wasm::Function*const,wasm::GenerateGlobalEffects::run(wasm::Module*)::FuncInfo>
                       (ppVar4);
    __end3 = std::
             unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
             ::begin(&ptVar6->calledFunctions);
    called = (Name *)std::
                     unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                     ::end(&ptVar6->calledFunctions);
    while (bVar1 = std::__detail::operator!=
                             (&__end3.super__Node_iterator_base<wasm::Name,_true>,
                              (_Node_iterator_base<wasm::Name,_true> *)&called), bVar1) {
      local_1a0 = std::__detail::_Node_iterator<wasm::Name,_true,_true>::operator*(&__end3);
      std::pair<wasm::Name,_wasm::Name>::pair<wasm::Name_&,_true>
                (&local_1c0,(Name *)*ppFVar5,local_1a0);
      item.first.super_IString.str._M_str = local_1c0.first.super_IString.str._M_str;
      item.first.super_IString.str._M_len = local_1c0.first.super_IString.str._M_len;
      item.second.super_IString.str._M_len = local_1c0.second.super_IString.str._M_len;
      item.second.super_IString.str._M_str = local_1c0.second.super_IString.str._M_str;
      UniqueDeferredQueue<std::pair<wasm::Name,_wasm::Name>_>::push
                ((UniqueDeferredQueue<std::pair<wasm::Name,_wasm::Name>_> *)&__range2,item);
      std::__detail::_Node_iterator<wasm::Name,_true,_true>::operator++(&__end3);
    }
    std::_Rb_tree_iterator<std::pair<wasm::Function_*const,_FuncInfo>_>::operator++(&__end2);
  }
  while( true ) {
    bVar1 = UniqueDeferredQueue<std::pair<wasm::Name,_wasm::Name>_>::empty
                      ((UniqueDeferredQueue<std::pair<wasm::Name,_wasm::Name>_> *)&__range2);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __end2_1 = std::
                 map<wasm::Function_*,_FuncInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_FuncInfo>_>_>
                 ::begin((map<wasm::Function_*,_FuncInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_FuncInfo>_>_>
                          *)&analysis);
      local_290._M_node =
           (_Base_ptr)
           std::
           map<wasm::Function_*,_FuncInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_FuncInfo>_>_>
           ::end((map<wasm::Function_*,_FuncInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_FuncInfo>_>_>
                  *)&analysis);
      while (bVar1 = std::operator!=(&__end2_1,&local_290), bVar1) {
        ppVar4 = std::_Rb_tree_iterator<std::pair<wasm::Function_*const,_FuncInfo>_>::operator*
                           (&__end2_1);
        ppFVar5 = std::
                  get<0ul,wasm::Function*const,wasm::GenerateGlobalEffects::run(wasm::Module*)::FuncInfo>
                            (ppVar4);
        ptVar6 = std::
                 get<1ul,wasm::Function*const,wasm::GenerateGlobalEffects::run(wasm::Module*)::FuncInfo>
                           (ppVar4);
        pmVar7 = std::
                 unordered_map<wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
                 ::operator[]((unordered_map<wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
                               *)&work.count._M_h._M_single_bucket,(key_type *)*ppFVar5);
        sVar3 = std::
                unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                ::count(pmVar7,(key_type *)*ppFVar5);
        if ((sVar3 != 0) &&
           (bVar1 = std::optional::operator_cast_to_bool((optional *)ptVar6), bVar1)) {
          pEVar8 = std::optional<wasm::EffectAnalyzer>::operator->(&ptVar6->effects);
          pEVar8->trap = true;
        }
        std::_Rb_tree_iterator<std::pair<wasm::Function_*const,_FuncInfo>_>::operator++(&__end2_1);
      }
      __end2_2 = std::
                 map<wasm::Function_*,_FuncInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_FuncInfo>_>_>
                 ::begin((map<wasm::Function_*,_FuncInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_FuncInfo>_>_>
                          *)&analysis);
      local_2c0._M_node =
           (_Base_ptr)
           std::
           map<wasm::Function_*,_FuncInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_FuncInfo>_>_>
           ::end((map<wasm::Function_*,_FuncInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_FuncInfo>_>_>
                  *)&analysis);
      while (bVar1 = std::operator!=(&__end2_2,&local_2c0), bVar1) {
        ppVar4 = std::_Rb_tree_iterator<std::pair<wasm::Function_*const,_FuncInfo>_>::operator*
                           (&__end2_2);
        ppFVar5 = std::
                  get<0ul,wasm::Function*const,wasm::GenerateGlobalEffects::run(wasm::Module*)::FuncInfo>
                            (ppVar4);
        ptVar6 = std::
                 get<1ul,wasm::Function*const,wasm::GenerateGlobalEffects::run(wasm::Module*)::FuncInfo>
                           (ppVar4);
        pmVar7 = std::
                 unordered_map<wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
                 ::operator[]((unordered_map<wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
                               *)&work.count._M_h._M_single_bucket,(key_type *)*ppFVar5);
        __end3_2 = std::
                   unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                   ::begin(pmVar7);
        caller_1 = (Name *)std::
                           unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                           ::end(pmVar7);
        while (bVar1 = std::__detail::operator!=
                                 (&__end3_2.super__Node_iterator_base<wasm::Name,_true>,
                                  (_Node_iterator_base<wasm::Name,_true> *)&caller_1), bVar1) {
          callerEffects =
               (optional<wasm::EffectAnalyzer> *)
               std::__detail::_Node_iterator<wasm::Name,_true,_true>::operator*(&__end3_2);
          local_310 = Module::getFunction((Module *)analysis._48_8_,
                                          (IString)*(IString *)
                                                    &(callerEffects->
                                                                                                          
                                                  super__Optional_base<wasm::EffectAnalyzer,_false,_false>
                                                  )._M_payload.
                                                  super__Optional_payload<wasm::EffectAnalyzer,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::EffectAnalyzer>
                                                  ._M_payload);
          local_308 = std::
                      map<wasm::Function_*,_FuncInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_FuncInfo>_>_>
                      ::operator[]((map<wasm::Function_*,_FuncInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_FuncInfo>_>_>
                                    *)&analysis,&local_310);
          bVar1 = std::optional::operator_cast_to_bool((optional *)local_308);
          if (bVar1) {
            bVar1 = std::optional::operator_cast_to_bool((optional *)ptVar6);
            if (bVar1) {
              pEVar8 = std::optional<wasm::EffectAnalyzer>::operator->(&local_308->effects);
              other = std::optional<wasm::EffectAnalyzer>::operator*(&ptVar6->effects);
              EffectAnalyzer::mergeIn(pEVar8,other);
            }
            else {
              std::optional<wasm::EffectAnalyzer>::reset(&local_308->effects);
            }
          }
          std::__detail::_Node_iterator<wasm::Name,_true,_true>::operator++(&__end3_2);
        }
        std::_Rb_tree_iterator<std::pair<wasm::Function_*const,_FuncInfo>_>::operator++(&__end2_2);
      }
      __end2_3 = std::
                 map<wasm::Function_*,_FuncInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_FuncInfo>_>_>
                 ::begin((map<wasm::Function_*,_FuncInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_FuncInfo>_>_>
                          *)&analysis);
      local_340._M_node =
           (_Base_ptr)
           std::
           map<wasm::Function_*,_FuncInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_FuncInfo>_>_>
           ::end((map<wasm::Function_*,_FuncInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_FuncInfo>_>_>
                  *)&analysis);
      while (bVar1 = std::operator!=(&__end2_3,&local_340), bVar1) {
        func_3 = &std::_Rb_tree_iterator<std::pair<wasm::Function_*const,_FuncInfo>_>::operator*
                            (&__end2_3)->first;
        info_3 = (type *)std::
                         get<0ul,wasm::Function*const,wasm::GenerateGlobalEffects::run(wasm::Module*)::FuncInfo>
                                   ((pair<wasm::Function_*const,_FuncInfo> *)func_3);
        local_368._16_8_ =
             std::
             get<1ul,wasm::Function*const,wasm::GenerateGlobalEffects::run(wasm::Module*)::FuncInfo>
                       ((pair<wasm::Function_*const,_FuncInfo> *)func_3);
        std::__shared_ptr<wasm::EffectAnalyzer,_(__gnu_cxx::_Lock_policy)2>::reset
                  ((__shared_ptr<wasm::EffectAnalyzer,_(__gnu_cxx::_Lock_policy)2> *)
                   (*(long *)&(info_3->effects).
                              super__Optional_base<wasm::EffectAnalyzer,_false,_false>._M_payload.
                              super__Optional_payload<wasm::EffectAnalyzer,_true,_false,_false>.
                              super__Optional_payload_base<wasm::EffectAnalyzer>._M_payload + 0x1c0)
                  );
        bVar1 = std::optional::operator_cast_to_bool((optional *)local_368._16_8_);
        if (bVar1) {
          std::optional<wasm::EffectAnalyzer>::operator*
                    ((optional<wasm::EffectAnalyzer> *)local_368._16_8_);
          std::make_shared<wasm::EffectAnalyzer,wasm::EffectAnalyzer&>((EffectAnalyzer *)local_368);
          std::shared_ptr<wasm::EffectAnalyzer>::operator=
                    ((shared_ptr<wasm::EffectAnalyzer> *)
                     (*(long *)&(info_3->effects).
                                super__Optional_base<wasm::EffectAnalyzer,_false,_false>._M_payload.
                                super__Optional_payload<wasm::EffectAnalyzer,_true,_false,_false>.
                                super__Optional_payload_base<wasm::EffectAnalyzer>._M_payload +
                     0x1c0),(shared_ptr<wasm::EffectAnalyzer> *)local_368);
          std::shared_ptr<wasm::EffectAnalyzer>::~shared_ptr
                    ((shared_ptr<wasm::EffectAnalyzer> *)local_368);
        }
        std::_Rb_tree_iterator<std::pair<wasm::Function_*const,_FuncInfo>_>::operator++(&__end2_3);
      }
      UniqueDeferredQueue<std::pair<wasm::Name,_wasm::Name>_>::~UniqueDeferredQueue
                ((UniqueDeferredQueue<std::pair<wasm::Name,_wasm::Name>_> *)&__range2);
      std::
      unordered_map<wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
      ::~unordered_map((unordered_map<wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
                        *)&work.count._M_h._M_single_bucket);
      wasm::ModuleUtils::
      ParallelFunctionAnalysis<FuncInfo,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>::
      ~ParallelFunctionAnalysis
                ((ParallelFunctionAnalysis<FuncInfo,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
                  *)local_50);
      return;
    }
    UniqueDeferredQueue<std::pair<wasm::Name,_wasm::Name>_>::pop
              ((pair<wasm::Name,_wasm::Name> *)&caller,
               (UniqueDeferredQueue<std::pair<wasm::Name,_wasm::Name>_> *)&__range2);
    called_1 = std::get<0ul,wasm::Name,wasm::Name>((pair<wasm::Name,_wasm::Name> *)&caller);
    local_1f0 = std::get<1ul,wasm::Name,wasm::Name>((pair<wasm::Name,_wasm::Name> *)&caller);
    pmVar7 = std::
             unordered_map<wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
             ::operator[]((unordered_map<wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
                           *)&work.count._M_h._M_single_bucket,local_1f0);
    sVar3 = std::
            unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
            ::count(pmVar7,called_1);
    if (sVar3 != 0) break;
    pmVar7 = std::
             unordered_map<wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
             ::operator[]((unordered_map<wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
                           *)&work.count._M_h._M_single_bucket,local_1f0);
    pVar9 = std::
            unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
            ::insert(pmVar7,called_1);
    calledInfo = (mapped_type *)pVar9.first.super__Node_iterator_base<wasm::Name,_true>._M_cur;
    local_1f8 = pVar9.second;
    local_210 = Module::getFunction((Module *)analysis._48_8_,(Name)(local_1f0->super_IString).str);
    local_208 = std::
                map<wasm::Function_*,_FuncInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_FuncInfo>_>_>
                ::operator[]((map<wasm::Function_*,_FuncInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_FuncInfo>_>_>
                              *)&analysis,&local_210);
    this_00 = &local_208->calledFunctions;
    __end3_1 = std::
               unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
               ::begin(this_00);
    local_240._M_cur =
         (__node_type *)
         std::
         unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
         ::end(this_00);
    while (bVar1 = std::__detail::operator!=
                             (&__end3_1.super__Node_iterator_base<wasm::Name,_true>,&local_240),
          bVar1) {
      pNVar2 = std::__detail::_Node_iterator<wasm::Name,_true,_true>::operator*(&__end3_1);
      auStack_258 = (undefined1  [8])(pNVar2->super_IString).str._M_len;
      calledByCalled.super_IString.str._M_len = (size_t)(pNVar2->super_IString).str._M_str;
      pmVar7 = std::
               unordered_map<wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
               ::operator[]((unordered_map<wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
                             *)&work.count._M_h._M_single_bucket,(key_type *)auStack_258);
      sVar3 = std::
              unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
              ::count(pmVar7,called_1);
      if (sVar3 == 0) {
        std::pair<wasm::Name,_wasm::Name>::pair<wasm::Name_&,_wasm::Name_&,_true>
                  ((pair<wasm::Name,_wasm::Name> *)&__range2_1,called_1,(Name *)auStack_258);
        item_00.first.super_IString.str._M_str = pcStack_270;
        item_00.first.super_IString.str._M_len = (size_t)__range2_1;
        item_00.second.super_IString.str._M_len = local_268;
        item_00.second.super_IString.str._M_str = pcStack_260;
        UniqueDeferredQueue<std::pair<wasm::Name,_wasm::Name>_>::push
                  ((UniqueDeferredQueue<std::pair<wasm::Name,_wasm::Name>_> *)&__range2,item_00);
      }
      std::__detail::_Node_iterator<wasm::Name,_true,_true>::operator++(&__end3_1);
    }
  }
  __assert_fail("!callers[called].count(caller)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/GlobalEffects.cpp"
                ,0x82,"virtual void wasm::GenerateGlobalEffects::run(Module *)");
}

Assistant:

void run(Module* module) override {
    // First, we do a scan of each function to see what effects they have,
    // including which functions they call directly (so that we can compute
    // transitive effects later).

    struct FuncInfo {
      // Effects in this function.
      std::optional<EffectAnalyzer> effects;

      // Directly-called functions from this function.
      std::unordered_set<Name> calledFunctions;
    };

    ModuleUtils::ParallelFunctionAnalysis<FuncInfo> analysis(
      *module, [&](Function* func, FuncInfo& funcInfo) {
        if (func->imported()) {
          // Imports can do anything, so we need to assume the worst anyhow,
          // which is the same as not specifying any effects for them in the
          // map (which we do by not setting funcInfo.effects).
          return;
        }

        // Gather the effects.
        funcInfo.effects.emplace(getPassOptions(), *module, func);

        if (funcInfo.effects->calls) {
          // There are calls in this function, which we will analyze in detail.
          // Clear the |calls| field first, and we'll handle calls of all sorts
          // below.
          funcInfo.effects->calls = false;

          // Clear throws as well, as we are "forgetting" calls right now, and
          // want to forget their throwing effect as well. If we see something
          // else that throws, below, then we'll note that there.
          funcInfo.effects->throws_ = false;

          struct CallScanner
            : public PostWalker<CallScanner,
                                UnifiedExpressionVisitor<CallScanner>> {
            Module& wasm;
            PassOptions& options;
            FuncInfo& funcInfo;

            CallScanner(Module& wasm, PassOptions& options, FuncInfo& funcInfo)
              : wasm(wasm), options(options), funcInfo(funcInfo) {}

            void visitExpression(Expression* curr) {
              ShallowEffectAnalyzer effects(options, wasm, curr);
              if (auto* call = curr->dynCast<Call>()) {
                // Note the direct call.
                funcInfo.calledFunctions.insert(call->target);
              } else if (effects.calls) {
                // This is an indirect call of some sort, so we must assume the
                // worst. To do so, clear the effects, which indicates nothing
                // is known (so anything is possible).
                // TODO: We could group effects by function type etc.
                funcInfo.effects.reset();
              } else {
                // No call here, but update throwing if we see it. (Only do so,
                // however, if we have effects; if we cleared it - see before -
                // then we assume the worst anyhow, and have nothing to update.)
                if (effects.throws_ && funcInfo.effects) {
                  funcInfo.effects->throws_ = true;
                }
              }
            }
          };
          CallScanner scanner(*module, getPassOptions(), funcInfo);
          scanner.walkFunction(func);
        }
      });

    // Compute the transitive closure of effects. To do so, first construct for
    // each function a list of the functions that it is called by (so we need to
    // propogate its effects to them), and then we'll construct the closure of
    // that.
    //
    // callers[foo] = [func that calls foo, another func that calls foo, ..]
    //
    std::unordered_map<Name, std::unordered_set<Name>> callers;

    // Our work queue contains info about a new call pair: a call from a caller
    // to a called function, that is information we then apply and propagate.
    using CallPair = std::pair<Name, Name>; // { caller, called }
    UniqueDeferredQueue<CallPair> work;
    for (auto& [func, info] : analysis.map) {
      for (auto& called : info.calledFunctions) {
        work.push({func->name, called});
      }
    }

    // Compute the transitive closure of the call graph, that is, fill out
    // |callers| so that it contains the list of all callers - even through a
    // chain - of each function.
    while (!work.empty()) {
      auto [caller, called] = work.pop();

      // We must not already have an entry for this call (that would imply we
      // are doing wasted work).
      assert(!callers[called].count(caller));

      // Apply the new call information.
      callers[called].insert(caller);

      // We just learned that |caller| calls |called|. It also calls
      // transitively, which we need to propagate to all places unaware of that
      // information yet.
      //
      //   caller => called => called by called
      //
      auto& calledInfo = analysis.map[module->getFunction(called)];
      for (auto calledByCalled : calledInfo.calledFunctions) {
        if (!callers[calledByCalled].count(caller)) {
          work.push({caller, calledByCalled});
        }
      }
    }

    // Now that we have transitively propagated all static calls, apply that
    // information. First, apply infinite recursion: if a function can call
    // itself then it might recurse infinitely, which we consider an effect (a
    // trap).
    for (auto& [func, info] : analysis.map) {
      if (callers[func->name].count(func->name)) {
        if (info.effects) {
          info.effects->trap = true;
        }
      }
    }

    // Next, apply function effects to their callers.
    for (auto& [func, info] : analysis.map) {
      auto& funcEffects = info.effects;

      for (auto& caller : callers[func->name]) {
        auto& callerEffects = analysis.map[module->getFunction(caller)].effects;
        if (!callerEffects) {
          // Nothing is known for the caller, which is already the worst case.
          continue;
        }

        if (!funcEffects) {
          // Nothing is known for the called function, which means nothing is
          // known for the caller either.
          callerEffects.reset();
          continue;
        }

        // Add func's effects to the caller.
        callerEffects->mergeIn(*funcEffects);
      }
    }

    // Generate the final data, starting from a blank slate where nothing is
    // known.
    for (auto& [func, info] : analysis.map) {
      func->effects.reset();
      if (!info.effects) {
        continue;
      }

      func->effects = std::make_shared<EffectAnalyzer>(*info.effects);
    }
  }